

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utAssbinImportExport.cpp
# Opt level: O0

bool __thiscall utAssbinImportExport::importerTest(utAssbinImportExport *this)

{
  bool bVar1;
  aiScene *paVar2;
  char *message;
  aiScene *newScene;
  Message local_58;
  aiReturn local_50 [2];
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  Exporter exporter;
  aiScene *scene;
  Importer importer;
  utAssbinImportExport *this_local;
  
  importer.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  paVar2 = Assimp::Importer::ReadFile
                     ((Importer *)&scene,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/OBJ/spider.obj"
                      ,0x400);
  Assimp::Exporter::Exporter((Exporter *)&gtest_ar.message_);
  local_50[1] = 0;
  local_50[0] = Assimp::Exporter::Export
                          ((Exporter *)&gtest_ar.message_,paVar2,"assbin",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/OBJ/spider_out.assbin"
                           ,0,(ExportProperties *)0x0);
  testing::internal::EqHelper<false>::Compare<aiReturn,aiReturn>
            ((EqHelper<false> *)local_48,"aiReturn_SUCCESS",
             "exporter.Export( scene, \"assbin\", \"/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models\" \"/OBJ/spider_out.assbin\" )"
             ,local_50 + 1,local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&newScene,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utAssbinImportExport.cpp"
               ,0x3b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&newScene,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&newScene);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  paVar2 = Assimp::Importer::ReadFile
                     ((Importer *)&scene,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/OBJ/spider_out.assbin"
                      ,0x400);
  Assimp::Exporter::~Exporter((Exporter *)&gtest_ar.message_);
  Assimp::Importer::~Importer((Importer *)&scene);
  return paVar2 != (aiScene *)0x0;
}

Assistant:

bool importerTest() override {
        Importer importer;
        const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/OBJ/spider.obj", aiProcess_ValidateDataStructure );

        Exporter exporter;
        EXPECT_EQ( aiReturn_SUCCESS, exporter.Export( scene, "assbin", ASSIMP_TEST_MODELS_DIR "/OBJ/spider_out.assbin" ) );
        const aiScene *newScene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/OBJ/spider_out.assbin", aiProcess_ValidateDataStructure );

        return newScene != nullptr;
    }